

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hood.h
# Opt level: O0

size_t __thiscall
robin_hood::detail::
Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
::insert_move(Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
              *this,Node *keyval)

{
  Node *pNVar1;
  size_t insertion_idx_00;
  bool bVar2;
  uint8_t uVar3;
  type key;
  Node *l;
  uint8_t insertion_info;
  size_t insertion_idx;
  size_t sStack_20;
  InfoType info;
  size_t idx;
  Node *keyval_local;
  Table<true,_80UL,_Rml::Character,_Rml::FontFaceLayer::TextureBox,_robin_hood::hash<Rml::Character,_void>,_std::equal_to<Rml::Character>_>
  *this_local;
  
  idx = (size_t)keyval;
  keyval_local = (Node *)this;
  if ((this->mMaxNumElementsAllowed == 0) && (bVar2 = try_increase_info(this), !bVar2)) {
    throwOverflowError(this);
  }
  sStack_20 = 0;
  insertion_idx._4_4_ = 0;
  key = Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>
        ::
        DataNode<robin_hood::detail::Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>,true>
        ::getFirst<robin_hood::pair<Rml::Character,Rml::FontFaceLayer::TextureBox>>
                  ((DataNode<robin_hood::detail::Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>,true>
                    *)idx);
  Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>
  ::keyToIdx<Rml::Character&>
            ((Table<true,80ul,Rml::Character,Rml::FontFaceLayer::TextureBox,robin_hood::hash<Rml::Character,void>,std::equal_to<Rml::Character>>
              *)this,key,&stack0xffffffffffffffe0,(InfoType *)((long)&insertion_idx + 4));
  for (; insertion_idx_00 = sStack_20, insertion_idx._4_4_ <= this->mInfo[sStack_20];
      insertion_idx._4_4_ = this->mInfoInc + insertion_idx._4_4_) {
    sStack_20 = sStack_20 + 1;
  }
  uVar3 = (uint8_t)insertion_idx._4_4_;
  if (0xff < (insertion_idx._4_4_ & 0xff) + this->mInfoInc) {
    this->mMaxNumElementsAllowed = 0;
  }
  while (this->mInfo[sStack_20] != '\0') {
    next(this,(InfoType *)((long)&insertion_idx + 4),&stack0xffffffffffffffe0);
  }
  pNVar1 = this->mKeyVals;
  if (sStack_20 == insertion_idx_00) {
    memcpy(pNVar1 + insertion_idx_00,(void *)idx,0x28);
  }
  else {
    shiftUp(this,sStack_20,insertion_idx_00);
    memcpy(pNVar1 + insertion_idx_00,(void *)idx,0x28);
  }
  this->mInfo[insertion_idx_00] = uVar3;
  this->mNumElements = this->mNumElements + 1;
  return insertion_idx_00;
}

Assistant:

size_t insert_move(Node&& keyval) {
        // we don't retry, fail if overflowing
        // don't need to check max num elements
        if (0 == mMaxNumElementsAllowed && !try_increase_info()) {
            throwOverflowError(); // impossible to reach LCOV_EXCL_LINE
        }

        size_t idx{};
        InfoType info{};
        keyToIdx(keyval.getFirst(), &idx, &info);

        // skip forward. Use <= because we are certain that the element is not there.
        while (info <= mInfo[idx]) {
            idx = idx + 1;
            info += mInfoInc;
        }

        // key not found, so we are now exactly where we want to insert it.
        auto const insertion_idx = idx;
        auto const insertion_info = static_cast<uint8_t>(info);
        if (ROBIN_HOOD_UNLIKELY(insertion_info + mInfoInc > 0xFF)) {
            mMaxNumElementsAllowed = 0;
        }

        // find an empty spot
        while (0 != mInfo[idx]) {
            next(&info, &idx);
        }

        auto& l = mKeyVals[insertion_idx];
        if (idx == insertion_idx) {
            ::new (static_cast<void*>(&l)) Node(std::move(keyval));
        } else {
            shiftUp(idx, insertion_idx);
            l = std::move(keyval);
        }

        // put at empty spot
        mInfo[insertion_idx] = insertion_info;

        ++mNumElements;
        return insertion_idx;
    }